

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::MAP(Value *__return_storage_ptr__,
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *kv_pairs)

{
  Value *pVVar1;
  __node_base *p_Var2;
  long lVar3;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l;
  allocator_type local_271;
  Value *local_270;
  vector<duckdb::Value,_true> pairs;
  LogicalType local_250;
  LogicalType local_238;
  LogicalType local_220;
  string local_208;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1e8;
  string local_1d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_1b0 [2];
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  LogicalType::LogicalType(&local_220,SQLNULL);
  Value(__return_storage_ptr__,&local_220);
  LogicalType::~LogicalType(&local_220);
  LogicalType::LogicalType(&local_238,VARCHAR);
  LogicalType::LogicalType(&local_250,VARCHAR);
  LogicalType::MAP((LogicalType *)local_1b0,&local_238,&local_250);
  LogicalType::operator=(&__return_storage_ptr__->type_,(LogicalType *)local_1b0);
  LogicalType::~LogicalType((LogicalType *)local_1b0);
  LogicalType::~LogicalType(&local_250);
  LogicalType::~LogicalType(&local_238);
  __return_storage_ptr__->is_null = false;
  pairs.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pairs.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pairs.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var2 = &(kv_pairs->_M_h)._M_before_begin;
  local_270 = __return_storage_ptr__;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    ::std::__cxx11::string::string((string *)&local_1d0,(string *)(p_Var2 + 1));
    Value(&local_b0,&local_1d0);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::pair<const_char_(&)[4],_duckdb::Value,_true>(local_1b0,(char (*) [4])0x115985e,&local_b0);
    ::std::__cxx11::string::string((string *)&local_208,(string *)(p_Var2 + 5));
    Value(&local_f0,&local_208);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::pair<const_char_(&)[6],_duckdb::Value,_true>(local_1b0 + 1,(char (*) [6])0x105f5a9,&local_f0);
    __l._M_len = 2;
    __l._M_array = local_1b0;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::vector(&local_1e8,__l,&local_271);
    STRUCT(&local_70,(child_list_t<Value> *)&local_1e8);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&pairs,&local_70);
    ~Value(&local_70);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~vector(&local_1e8);
    lVar3 = 0x60;
    do {
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
               *)((long)&local_1b0[0].first._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x60;
    } while (lVar3 != -0x60);
    ~Value(&local_f0);
    ::std::__cxx11::string::~string((string *)&local_208);
    ~Value(&local_b0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
  }
  make_shared_ptr<duckdb::NestedValueInfo,duckdb::vector<duckdb::Value,true>>
            ((vector<duckdb::Value,_true> *)local_1b0);
  pVVar1 = local_270;
  shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::NestedValueInfo,_0>
            (&local_270->value_info_,(shared_ptr<duckdb::NestedValueInfo,_true> *)local_1b0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b0[0].first._M_string_length);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&pairs);
  return pVVar1;
}

Assistant:

Value Value::MAP(const unordered_map<string, string> &kv_pairs) {
	Value result;
	result.type_ = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	result.is_null = false;
	vector<Value> pairs;
	for (auto &kv : kv_pairs) {
		pairs.push_back(Value::STRUCT({{"key", Value(kv.first)}, {"value", Value(kv.second)}}));
	}
	result.value_info_ = make_shared_ptr<NestedValueInfo>(std::move(pairs));
	return result;
}